

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O1

int __thiscall
chrono::collision::BoxBoxCollisionTest2::RectQuadEdgeIntersectionTest::operator()
          (RectQuadEdgeIntersectionTest *this,double *envelope,double *rect,double *quad,
          bool *inside,double *ret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  double *r;
  double *pdVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  double qyt;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double qxt;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  
  lVar5 = 0;
  lVar6 = 1;
  iVar4 = 0;
  do {
    pdVar7 = (double *)((long)quad + lVar5 + 0x10);
    dVar13 = pdVar7[-2];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar13;
    dVar11 = pdVar7[-1];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar11;
    if (lVar5 == 0x30) {
      pdVar7 = quad;
    }
    dVar14 = *pdVar7;
    dVar1 = pdVar7[1];
    if ((inside[lVar6 + -1] != true) || (inside[(uint)lVar6 & 3] == false)) {
      dVar2 = dVar14 - dVar13;
      dVar3 = dVar1 - dVar11;
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        auVar17._0_8_ = dVar3 / dVar2;
        auVar17._8_8_ = 0;
        dVar18 = -*rect;
        if (((dVar13 < dVar18) && (dVar18 < dVar14)) || ((dVar18 < dVar13 && (dVar14 < dVar18)))) {
          auVar20._8_8_ = 0;
          auVar20._0_8_ = dVar18 - dVar13;
          auVar20 = vfmadd213sd_fma(auVar20,auVar17,auVar9);
          dVar19 = auVar20._0_8_;
          if ((-rect[1] < dVar19) && (dVar19 < rect[1])) {
            *ret = dVar18;
            ret[1] = dVar19;
            ret = ret + 2;
            iVar4 = iVar4 + 1;
          }
        }
        dVar18 = *rect;
        if (((dVar13 < dVar18) && (dVar18 < dVar14)) || ((dVar18 < dVar13 && (dVar14 < dVar18)))) {
          auVar15._8_8_ = 0;
          auVar15._0_8_ = dVar18 - dVar13;
          auVar9 = vfmadd213sd_fma(auVar17,auVar15,auVar9);
          dVar13 = auVar9._0_8_;
          if ((-rect[1] < dVar13) && (dVar13 < rect[1])) {
            *ret = dVar18;
            ret[1] = dVar13;
            ret = ret + 2;
            iVar4 = iVar4 + 1;
          }
        }
      }
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        auVar12._0_8_ = dVar2 / dVar3;
        auVar12._8_8_ = 0;
        dVar13 = -rect[1];
        if (((dVar11 < dVar13) && (dVar13 < dVar1)) || ((dVar13 < dVar11 && (dVar1 < dVar13)))) {
          auVar16._8_8_ = 0;
          auVar16._0_8_ = dVar13 - dVar11;
          auVar9 = vfmadd213sd_fma(auVar16,auVar12,auVar8);
          dVar14 = auVar9._0_8_;
          if ((-*rect < dVar14) && (dVar14 < *rect)) {
            *ret = dVar14;
            ret[1] = dVar13;
            ret = ret + 2;
            iVar4 = iVar4 + 1;
          }
        }
        dVar13 = rect[1];
        if (((dVar11 < dVar13) && (dVar13 < dVar1)) || ((dVar13 < dVar11 && (dVar1 < dVar13)))) {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = dVar13 - dVar11;
          auVar8 = vfmadd213sd_fma(auVar12,auVar10,auVar8);
          dVar11 = auVar8._0_8_;
          if ((-*rect < dVar11) && (dVar11 < *rect)) {
            *ret = dVar11;
            ret[1] = dVar13;
            ret = ret + 2;
            iVar4 = iVar4 + 1;
          }
        }
      }
    }
    lVar5 = lVar5 + 0x10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  return iVar4;
}

Assistant:

int operator()(double const& envelope, double* rect, double* quad, bool* inside, double* ret) {
            int cnt = 0;
            double* r = ret;
            {
                //--- Test the four edges of the quad for crossing the edges of the rect.
                double qx0, qy0, qx1, qy1, tst;
                double* q = quad;
                for (int i = 0; i < 4; ++i) {
                    qx0 = *q;
                    ++q;
                    qy0 = *q;
                    ++q;
                    double* nextq = (i == 3) ? quad : q;
                    qx1 = *nextq;
                    ++nextq;
                    qy1 = *nextq;
                    bool inside0 = inside[i];
                    bool inside1 = inside[(i + 1) % 4];
                    if (inside0 && inside1)
                        continue;
                    double dx = (qx1 - qx0);
                    double dy = (qy1 - qy0);
                    if (dx) {
                        double alpha = dy / dx;
                        tst = -rect[0];  //--- left side
                        if (((qx0 < tst) && (qx1 > tst)) || ((qx0 > tst) && (qx1 < tst))) {
                            double qxt = -rect[0];
                            double qyt = qy0 + (qxt - qx0) * alpha;
                            if ((-rect[1] < qyt) && (qyt < rect[1])) {
                                *r = qxt;
                                ++r;
                                *r = qyt;
                                ++r;
                                ++cnt;
                            }
                        }
                        tst = rect[0];
                        if (((qx0 < tst) && (qx1 > tst)) || ((qx0 > tst) && (qx1 < tst))) {
                            double qxt = rect[0];
                            double qyt = qy0 + (qxt - qx0) * alpha;
                            if ((-rect[1] < qyt) && (qyt < rect[1])) {
                                *r = qxt;
                                ++r;
                                *r = qyt;
                                ++r;
                                ++cnt;
                            }
                        }
                    }
                    if (dy) {
                        double inv_alpha = dx / dy;
                        tst = -rect[1];  //--- bottom side
                        if (((qy0 < tst) && (qy1 > tst)) || ((qy0 > tst) && (qy1 < tst))) {
                            double qyt = -rect[1];
                            double qxt = qx0 + (qyt - qy0) * inv_alpha;
                            if ((-rect[0] < qxt) && (qxt < rect[0])) {
                                *r = qxt;
                                ++r;
                                *r = qyt;
                                ++r;
                                ++cnt;
                            }
                        }
                        tst = rect[1];  //--- top side
                        if (((qy0 < tst) && (qy1 > tst)) || ((qy0 > tst) && (qy1 < tst))) {
                            double qyt = rect[1];
                            double qxt = qx0 + (qyt - qy0) * inv_alpha;
                            if ((-rect[0] < qxt) && (qxt < rect[0])) {
                                *r = qxt;
                                ++r;
                                *r = qyt;
                                ++r;
                                ++cnt;
                            }
                        }
                    }
                }
            }
            return cnt;
        }